

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O3

bool __thiscall
SampleMuxerMetadata::Parse(SampleMuxerMetadata *this,char *file,Kind param_2,uint64_t track_num)

{
  Time *this_00;
  bool bVar1;
  int iVar2;
  char *__s;
  VttReader r;
  Parser p;
  Time t;
  SortableCue cue;
  VttReader local_e0;
  Parser local_d0;
  Time local_b8;
  SortableCue local_a8;
  
  libwebvtt::VttReader::VttReader(&local_e0);
  iVar2 = libwebvtt::VttReader::Open(&local_e0,file);
  if (iVar2 == 0) {
    libwebvtt::Parser::Parser(&local_d0,&local_e0.super_Reader);
    iVar2 = libwebvtt::Parser::Init(&local_d0);
    if (iVar2 < 0) {
      bVar1 = false;
      printf("Error parsing WebVTT file: \"%s\"\n",file);
    }
    else {
      local_a8.cue.identifier._M_dataplus._M_p = (pointer)&local_a8.cue.identifier.field_2;
      local_a8.cue.identifier._M_string_length = 0;
      local_a8.cue.identifier.field_2._M_local_buf[0] = '\0';
      local_a8.cue.settings.
      super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&local_a8.cue.settings;
      local_a8.cue.settings.
      super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl._M_node.
      _M_size = 0;
      local_a8.cue.payload.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.cue.payload;
      local_a8.cue.payload.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      local_b8.hours = -1;
      this_00 = &local_a8.cue.start_time;
      local_a8.track_num = track_num;
      local_a8.cue.settings.
      super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           local_a8.cue.settings.
           super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>._M_impl._M_node
           .super__List_node_base._M_next;
      local_a8.cue.payload.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           local_a8.cue.payload.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      while( true ) {
        iVar2 = libwebvtt::Parser::Parse(&local_d0,&local_a8.cue);
        if (iVar2 < 0) break;
        if (iVar2 != 0) {
          bVar1 = true;
          goto LAB_00115de3;
        }
        bVar1 = libwebvtt::Time::operator>=(this_00,&local_b8);
        if (!bVar1) {
          __s = "bad WebVTT cue timestamp (out-of-order)";
LAB_00115ddc:
          puts(__s);
          bVar1 = false;
          goto LAB_00115de3;
        }
        local_b8.hours = local_a8.cue.start_time.hours;
        local_b8.minutes = local_a8.cue.start_time.minutes;
        local_b8.seconds = local_a8.cue.start_time.seconds;
        local_b8.milliseconds = local_a8.cue.start_time.milliseconds;
        bVar1 = libwebvtt::Time::operator<(&local_a8.cue.stop_time,this_00);
        if (bVar1) {
          __s = "bad WebVTT cue timestamp (stop < start)";
          goto LAB_00115ddc;
        }
        std::
        _Rb_tree<SampleMuxerMetadata::SortableCue,SampleMuxerMetadata::SortableCue,std::_Identity<SampleMuxerMetadata::SortableCue>,std::less<SampleMuxerMetadata::SortableCue>,std::allocator<SampleMuxerMetadata::SortableCue>>
        ::_M_insert_equal<SampleMuxerMetadata::SortableCue_const&>
                  ((_Rb_tree<SampleMuxerMetadata::SortableCue,SampleMuxerMetadata::SortableCue,std::_Identity<SampleMuxerMetadata::SortableCue>,std::less<SampleMuxerMetadata::SortableCue>,std::allocator<SampleMuxerMetadata::SortableCue>>
                    *)&this->cues_set_,&local_a8);
      }
      bVar1 = false;
      printf("Error parsing WebVTT file: \"%s\"\n",file);
LAB_00115de3:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_a8.cue.payload.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      std::__cxx11::_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::_M_clear
                (&local_a8.cue.settings.
                  super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.cue.identifier._M_dataplus._M_p != &local_a8.cue.identifier.field_2) {
        operator_delete(local_a8.cue.identifier._M_dataplus._M_p);
      }
    }
    libwebvtt::Parser::~Parser(&local_d0);
  }
  else {
    bVar1 = false;
    printf("Unable to open WebVTT file: \"%s\"\n",file);
  }
  libwebvtt::VttReader::~VttReader(&local_e0);
  return bVar1;
}

Assistant:

bool SampleMuxerMetadata::Parse(const char* file, Kind /* kind */,
                                uint64_t track_num) {
  libwebvtt::VttReader r;
  int e = r.Open(file);

  if (e) {
    printf("Unable to open WebVTT file: \"%s\"\n", file);
    return false;
  }

  libwebvtt::Parser p(&r);

  e = p.Init();

  if (e < 0) {  // error
    printf("Error parsing WebVTT file: \"%s\"\n", file);
    return false;
  }

  SortableCue cue;
  cue.track_num = track_num;

  libwebvtt::Time t;
  t.hours = -1;

  for (;;) {
    cue_t& c = cue.cue;
    e = p.Parse(&c);

    if (e < 0) {  // error
      printf("Error parsing WebVTT file: \"%s\"\n", file);
      return false;
    }

    if (e > 0)  // EOF
      return true;

    if (c.start_time >= t) {
      t = c.start_time;
    } else {
      printf("bad WebVTT cue timestamp (out-of-order)\n");
      return false;
    }

    if (c.stop_time < c.start_time) {
      printf("bad WebVTT cue timestamp (stop < start)\n");
      return false;
    }

    cues_set_.insert(cue);
  }
}